

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_log2_m68k(float32 a,float_status *status)

{
  bool bVar1;
  float32 fVar2;
  uint uVar3;
  uint32_t zSig;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  flag zSign;
  uint uVar7;
  uint uVar8;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar4 = a & 0x7fffff;
  uVar7 = a >> 0x17 & 0xff;
  if (uVar7 == 0) {
    if (uVar4 == 0) {
      return 0xff800000;
    }
    uVar7 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar4 = uVar4 << ((char)(uVar7 ^ 0x1f) - 8U & 0x1f);
    uVar7 = 9 - (uVar7 ^ 0x1f);
  }
  if ((int)a < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    a = 0x7fffffff;
  }
  else {
    if (uVar7 != 0xff) {
      uVar4 = uVar4 | 0x800000;
      uVar3 = uVar7 * 0x800000 + 0xc0800000;
      uVar8 = 0x400000;
      do {
        uVar6 = (ulong)uVar4 * (ulong)uVar4;
        uVar5 = (uint)(uVar6 >> 0x17);
        uVar4 = uVar5 >> ((byte)(uint)(uVar6 >> 0x2f) & 1);
        uVar3 = uVar3 | (int)(uVar5 << 7) >> 0x1f & uVar8;
        bVar1 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar1);
      if ((int)uVar7 < 0x7f) {
        uVar3 = -uVar3;
        if (uVar3 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        zSig = uVar3 << ((char)uVar4 - 1U & 0x1f);
        zSign = '\x01';
      }
      else {
        if (uVar3 == 0) {
          uVar4 = 0x20;
        }
        else {
          uVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        zSig = uVar3 << ((char)uVar4 - 1U & 0x1f);
        zSign = '\0';
      }
      fVar2 = roundAndPackFloat32(zSign,0x86 - uVar4,zSig,status);
      return fVar2;
    }
    if (uVar4 != 0) {
      fVar2 = propagateFloat32NaN(a,0,status);
      return fVar2;
    }
  }
  return a;
}

Assistant:

float32 float32_log2(float32 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint32_t aSig, zSig, i;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat32( 1, 0xFF, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    if ( aExp == 0xFF ) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return a;
    }

    aExp -= 0x7F;
    aSig |= 0x00800000;
    zSign = aExp < 0;
    zSig = aExp << 23;

    for (i = 1 << 22; i > 0; i >>= 1) {
        aSig = ( (uint64_t)aSig * aSig ) >> 23;
        if ( aSig & 0x01000000 ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif

    return normalizeRoundAndPackFloat32(zSign, 0x85, zSig, status);
}